

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O2

void __thiscall AMColorset::initFromColors(AMColorset *this,uchar *colors,bool showlocks)

{
  byte bVar1;
  AMColorset *this_00;
  long lVar2;
  
  lVar2 = 2;
  this_00 = this;
  do {
    if (lVar2 == 0x4a) {
      this->displayLocks = showlocks;
      this->forcebackground = false;
      return;
    }
    bVar1 = colors[lVar2 + -1];
    if (colors[lVar2 + -2] == 1 && bVar1 == 0) {
      if (colors[lVar2] != '\0') {
        bVar1 = 0;
        goto LAB_003675ef;
      }
      this_00->c[0].Index = -1;
      this_00->c[0].RGB = 0xffffffff;
    }
    else {
LAB_003675ef:
      AMColor::FromRGB(this_00->c,(uint)colors[lVar2 + -2],(uint)bVar1,(uint)colors[lVar2]);
    }
    lVar2 = lVar2 + 3;
    this_00 = (AMColorset *)(this_00->c + 1);
  } while( true );
}

Assistant:

void initFromColors(const unsigned char *colors, bool showlocks)
	{
		for(int i=0, j=0; i<AM_NUM_COLORS; i++, j+=3)
		{
			if (colors[j] == 1 && colors[j+1] == 0 && colors[j+2] == 0)
			{
				c[i].setInvalid();
			}
			else
			{
				c[i].FromRGB(colors[j], colors[j+1], colors[j+2]);
			}
		}
		displayLocks = showlocks;
		forcebackground = false;
	}